

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

void __thiscall
nv::FloatImage::applyKernelHorizontal
          (FloatImage *this,PolyphaseKernel *k,int y,uint c,uint a,WrapMode wm,float *output)

{
  float fVar1;
  ushort uVar2;
  uint uVar3;
  float *pfVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int j;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar3 = k->m_length;
  uVar2 = this->m_width;
  fVar1 = k->m_width;
  pfVar4 = this->m_mem;
  iVar7 = (uint)this->m_height * (uint)uVar2;
  uVar6 = 0;
  uVar8 = (ulong)(uint)k->m_windowSize;
  if (k->m_windowSize < 1) {
    uVar8 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    fVar10 = floorf(((float)(uVar6 & 0xffffffff) + 0.5) * (1.0 / ((float)uVar3 / (float)uVar2)) -
                    fVar1);
    fVar13 = 0.0;
    fVar11 = 0.0;
    for (iVar9 = 0; (int)uVar8 != iVar9; iVar9 = iVar9 + 1) {
      pcVar5 = index(this,(char *)(ulong)(uint)((int)fVar10 + iVar9),y);
      fVar12 = (pfVar4[(ulong)(iVar7 * a) + (long)(int)pcVar5] + 0.00390625) *
               k->m_data[(uint)(k->m_windowSize * (int)uVar6 + iVar9)];
      fVar13 = fVar13 + fVar12;
      fVar11 = fVar11 + fVar12 * pfVar4[(ulong)(c * iVar7) + (long)(int)pcVar5];
    }
    output[uVar6] = fVar11 / fVar13;
  }
  return;
}

Assistant:

void FloatImage::applyKernelHorizontal(const PolyphaseKernel & k, int y, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_width);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvDebugCheck(right - left <= windowSize);
		
		float norm = 0.0f;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(left + j, y, wm);

			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}